

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.h
# Opt level: O0

void loop_filter_frame_mt_init
               (AV1_COMMON *cm,int start_mi_row,int end_mi_row,int *planes_to_lf,int num_workers,
               AV1LfSync *lf_sync,int lpf_opt_level,int num_mis_in_lpf_unit_height_log2)

{
  int rows;
  byte bVar1;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  AV1_COMMON *in_R9;
  int i;
  int sb_rows;
  undefined8 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = (byte)lf_sync;
  rows = *(int *)(in_RDI + 0x214) + (1 << (bVar1 & 0x1f)) + -1 >> (bVar1 & 0x1f);
  if (((in_R9->superres_upscaled_width == 0) || (rows != in_R9->superres_upscaled_height)) ||
     ((int)in_R9->buffer_removal_times[1] < in_R8D)) {
    av1_loop_filter_dealloc((AV1LfSync *)CONCAT44(rows,in_stack_ffffffffffffffd0));
    av1_loop_filter_alloc
              ((AV1LfSync *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,rows,
               in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  *(undefined1 *)(in_R9->buffer_removal_times + 9) = 0;
  for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
    memset(*(void **)(in_R9->buffer_removal_times + (long)iVar2 * 2 + -9),0xff,(long)rows << 2);
  }
  enqueue_lf_jobs((AV1LfSync *)in_R9,in_ESI,in_EDX,in_RCX,i,1 << (bVar1 & 0x1f));
  return;
}

Assistant:

static inline void loop_filter_frame_mt_init(
    AV1_COMMON *cm, int start_mi_row, int end_mi_row,
    const int planes_to_lf[MAX_MB_PLANE], int num_workers, AV1LfSync *lf_sync,
    int lpf_opt_level, int num_mis_in_lpf_unit_height_log2) {
  // Number of superblock rows
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, num_mis_in_lpf_unit_height_log2);

  if (!lf_sync->sync_range || sb_rows != lf_sync->rows ||
      num_workers > lf_sync->num_workers) {
    av1_loop_filter_dealloc(lf_sync);
    av1_loop_filter_alloc(lf_sync, cm, sb_rows, cm->width, num_workers);
  }
  lf_sync->lf_mt_exit = false;

  // Initialize cur_sb_col to -1 for all SB rows.
  for (int i = 0; i < MAX_MB_PLANE; i++) {
    memset(lf_sync->cur_sb_col[i], -1,
           sizeof(*(lf_sync->cur_sb_col[i])) * sb_rows);
  }

  enqueue_lf_jobs(lf_sync, start_mi_row, end_mi_row, planes_to_lf,
                  lpf_opt_level, (1 << num_mis_in_lpf_unit_height_log2));
}